

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode
JsDiagStartDebugging
          (JsRuntimeHandle runtimeHandle,JsDiagDebugEventCallback debugEventCallback,
          void *callbackState)

{
  DWORD *pDVar1;
  ThreadContext *threadContext;
  ScriptContext *this;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  JsrtDebugManager *pJVar5;
  undefined4 *puVar6;
  JsErrorCode JVar7;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_78 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_48;
  JsrtDebugManager *local_38;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_78,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar7 = JsErrorInvalidArgument;
    goto LAB_003afe21;
  }
  if (debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    JVar7 = JsErrorNullArgument;
    goto LAB_003afe21;
  }
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  threadContext = *runtimeHandle;
  if (threadContext->recycler != (Recycler *)0x0) {
    bVar3 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
    JVar7 = JsErrorHeapEnumInProgress;
    if (bVar3) goto LAB_003afe21;
  }
  JVar7 = JsErrorInThreadServiceCallback;
  if (((threadContext->threadService).isInCallback != false) ||
     (JVar7 = JsErrorRuntimeInUse, threadContext->callRootLevel != 0)) goto LAB_003afe21;
  ThreadContextScope::ThreadContextScope(&local_48,threadContext);
  JVar7 = JsErrorWrongThread;
  if (local_48.isValid != false) {
    pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    if (pJVar5 != (JsrtDebugManager *)0x0) {
      pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
      bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar5);
      JVar7 = JsErrorDiagAlreadyInDebugMode;
      if (bVar3) goto LAB_003afe0a;
    }
    JsrtRuntime::EnsureJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    pJVar5 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    JsrtDebugManager::SetDebugEventCallback(pJVar5,debugEventCallback,callbackState);
    if (threadContext->debugManager != (DebugManager *)0x0) {
      pDVar1 = &threadContext->debugManager->localsDisplayFlags;
      *(byte *)pDVar1 = (byte)*pDVar1 | 1;
    }
    this = *(ScriptContext **)(*runtimeHandle + 0x10e0);
    JVar7 = JsNoError;
    local_38 = pJVar5;
    if (this != (ScriptContext *)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      iVar4 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
      JVar7 = JsNoError;
      if ((char)iVar4 == '\0') {
        bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                             ,0x56,"(!scriptContext->IsScriptContextInDebugMode())",
                             "!scriptContext->IsScriptContextInDebugMode()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        Js::ScriptContext::GetDebugContext(this);
      }
    }
  }
LAB_003afe0a:
  ThreadContextScope::~ThreadContextScope(&local_48);
LAB_003afe21:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_78);
  return JVar7;
}

Assistant:

CHAKRA_API JsDiagStartDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsDiagDebugEventCallback debugEventCallback,
    _In_opt_ void* callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(debugEventCallback);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        if (runtime->GetJsrtDebugManager() != nullptr && runtime->GetJsrtDebugManager()->IsDebugEventCallbackSet())
        {
            return JsErrorDiagAlreadyInDebugMode;
        }

        // Create the debug object to save callback function and data
        runtime->EnsureJsrtDebugManager();

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        jsrtDebugManager->SetDebugEventCallback(debugEventCallback, callbackState);

        if (threadContext->GetDebugManager() != nullptr)
        {
            threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);
        }

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(!scriptContext->IsScriptContextInDebugMode());

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            if (debugContext->GetHostDebugContext() == nullptr)
            {
                debugContext->SetHostDebugContext(jsrtDebugManager);
            }

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerAttached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            // ScriptContext might get closed in OnDebuggerAttached
            if (!scriptContext->IsClosed())
            {
                Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
                probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
                probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
            }
        }

        return JsNoError;
    });
#endif
}